

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void * mspace_realloc_in_place(mspace msp,void *oldmem,size_t bytes)

{
  int *piVar1;
  mchunkptr pmVar2;
  size_t nb;
  
  if (oldmem != (void *)0x0) {
    if (bytes < 0xffffffffffffff80) {
      nb = 0x20;
      if (0x16 < bytes) {
        nb = bytes + 0x17 & 0xfffffffffffffff0;
      }
      pmVar2 = try_realloc_chunk((mstate)msp,(mchunkptr)((long)oldmem + -0x10),nb,0);
      if (pmVar2 != (mchunkptr)((long)oldmem + -0x10)) {
        return (void *)0x0;
      }
      return oldmem;
    }
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

void* mspace_realloc_in_place(mspace msp, void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem != 0) {
    if (bytes >= MAX_REQUEST) {
      MALLOC_FAILURE_ACTION;
    }
    else {
      size_t nb = request2size(bytes);
      mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
      mstate m = (mstate)msp;
#else /* FOOTERS */
      mstate m = get_mstate_for(oldp);
      (void)msp; /* placate people compiling -Wunused */
      if (!ok_magic(m)) {
        USAGE_ERROR_ACTION(m, oldmem);
        return 0;
      }
#endif /* FOOTERS */
      if (!PREACTION(m)) {
        mchunkptr newp = try_realloc_chunk(m, oldp, nb, 0);
        POSTACTION(m);
        if (newp == oldp) {
          check_inuse_chunk(m, newp);
          mem = oldmem;
        }
      }
    }
  }
  return mem;
}